

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.h
# Opt level: O3

void __thiscall Parameter::print_parameters(Parameter *this)

{
  long *plVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rank: ",6);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,this->k);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
  poVar2 = std::ostream::_M_insert<double>(this->lambda);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"epsilon: ",9);
  poVar2 = std::ostream::_M_insert<double>(this->eps);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max_iter: ",10);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,this->max_iter);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max_inner_iter: ",0x10);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,this->max_inner_iter);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nodes: ",7);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,this->num_of_machine);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"thread: ",8);
  plVar1 = (long *)std::ostream::operator<<(&std::cout,this->num_of_thread);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data_folder: ",0xd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->meta_path)._M_dataplus._M_p,
                      (this->meta_path)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"verbose: ",9);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------------------",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void print_parameters(){
        cout << "rank: " << Parameter::k << endl;
        cout << "lambda: " << Parameter::lambda << endl;
        cout << "epsilon: " << Parameter::eps << endl;
        cout << "max_iter: " << Parameter::max_iter << endl;
        cout << "max_inner_iter: " << Parameter::max_inner_iter << endl;
        cout << "nodes: " << Parameter::num_of_machine << endl;
        cout << "thread: " << Parameter::num_of_thread << endl;
        cout << "data_folder: " << Parameter::meta_path << endl;
        cout << "verbose: " << Parameter::verbose << endl;
        cout << "------------------------------------" << endl;
    }